

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * AddWindowSettings(char *name)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiContext *pIVar5;
  ImU32 IVar6;
  ImGuiWindowSettings *pIVar7;
  size_t sVar8;
  char *__dest;
  int iVar9;
  int iVar10;
  
  pIVar5 = GImGui;
  iVar10 = (GImGui->SettingsWindows).Size;
  iVar3 = (GImGui->SettingsWindows).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar3 < iVar10) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar7 = (ImGuiWindowSettings *)
               (*GImAllocatorAllocFunc)((long)iVar10 << 5,GImAllocatorUserData);
      pIVar4 = (pIVar5->SettingsWindows).Data;
      if (pIVar4 != (ImGuiWindowSettings *)0x0) {
        memcpy(pIVar7,pIVar4,(long)(pIVar5->SettingsWindows).Size << 5);
        pIVar4 = (pIVar5->SettingsWindows).Data;
        if (pIVar4 != (ImGuiWindowSettings *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar5->SettingsWindows).Data = pIVar7;
      (pIVar5->SettingsWindows).Capacity = iVar10;
    }
  }
  pIVar4 = (pIVar5->SettingsWindows).Data;
  iVar10 = (pIVar5->SettingsWindows).Size;
  puVar2 = (undefined8 *)((long)&pIVar4[iVar10].Pos.x + 1);
  *puVar2 = 0;
  puVar2[1] = 0;
  pIVar4 = pIVar4 + iVar10;
  pIVar4->Name = (char *)0x0;
  pIVar4->Id = 0;
  (pIVar4->Pos).x = 0.0;
  iVar10 = (pIVar5->SettingsWindows).Size;
  uVar1 = iVar10 + 1;
  (pIVar5->SettingsWindows).Size = uVar1;
  if (-1 < iVar10) {
    pIVar4 = (pIVar5->SettingsWindows).Data;
    pIVar7 = pIVar4 + ((ulong)uVar1 - 1);
    sVar8 = strlen(name);
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (char *)(*GImAllocatorAllocFunc)(sVar8 + 1,GImAllocatorUserData);
    memcpy(__dest,name,sVar8 + 1);
    pIVar7->Name = __dest;
    IVar6 = ImHash(name,0,0);
    pIVar4[(ulong)uVar1 - 1].Id = IVar6;
    return pIVar7;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<ImGuiWindowSettings>::back() [T = ImGuiWindowSettings]"
               );
}

Assistant:

static ImGuiWindowSettings* AddWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
    settings->Name = ImStrdup(name);
    settings->Id = ImHash(name, 0);
    return settings;
}